

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPort.h
# Opt level: O1

void __thiscall
rcg::CPort::CPort(CPort *this,void **vtt,shared_ptr<const_rcg::GenTLWrapper> *_gentl,void **_port)

{
  IPort IVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  IVar1 = *(IPort *)(vtt + 1);
  this->super_IPort = IVar1;
  *(void **)(&(this->super_IPort).field_0x0 + *(long *)((long)IVar1 + -0x28)) = vtt[2];
  IVar1 = (IPort)*vtt;
  this->super_IPort = IVar1;
  *(void **)(&(this->super_IPort).field_0x0 + *(long *)((long)IVar1 + -0x28)) = vtt[3];
  (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (_gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->port = _port;
  return;
}

Assistant:

virtual public IBase
    {
        //! Reads a chunk of bytes from the port
        virtual void Read(void *pBuffer, int64_t Address, int64_t Length) = 0;

        //! Writes a chunk of bytes to the port
        virtual void Write(const void *pBuffer, int64_t Address, int64_t Length) = 0;
    }